

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_write.cpp
# Opt level: O0

int main(void)

{
  uint8_t *puVar1;
  int32_t *piVar2;
  chars local_2c9;
  undefined1 local_2c8 [8];
  excerpt_appender appender;
  vanilla_chronicle chronicle;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  vanilla_chronicle_settings settings;
  string_ref local_30;
  chars *local_20;
  char *local_18;
  undefined1 *local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"/tmp/example",&local_c1);
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings
            ((vanilla_chronicle_settings *)local_a0,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  cornelich::vanilla_chronicle::vanilla_chronicle
            ((vanilla_chronicle *)&appender.m_buffer.m_data,(vanilla_chronicle_settings *)local_a0);
  cornelich::vanilla_chronicle::create_appender
            ((excerpt_appender *)local_2c8,(vanilla_chronicle *)&appender.m_buffer.m_data);
  cornelich::excerpt_appender::start_excerpt((excerpt_appender *)local_2c8,0x400);
  settings.m_data_cache_size._4_4_ = 0x2a;
  puVar1 = cornelich::util::buffer_view::data((buffer_view *)&appender.m_last_written_index);
  piVar2 = cornelich::util::buffer_view::position((buffer_view *)&appender.m_last_written_index);
  *(undefined4 *)(puVar1 + *piVar2) = settings.m_data_cache_size._4_4_;
  piVar2 = cornelich::util::buffer_view::position((buffer_view *)&appender.m_last_written_index);
  *piVar2 = *piVar2 + 4;
  local_10 = local_2c8;
  local_18 = "Some text";
  local_20 = &local_2c9;
  puVar1 = cornelich::util::buffer_view::data((buffer_view *)&appender.m_last_written_index);
  piVar2 = cornelich::util::buffer_view::position((buffer_view *)&appender.m_last_written_index);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_30,local_18);
  cornelich::writers::chars::operator()(&local_2c9,puVar1,piVar2,local_30);
  cornelich::excerpt_appender::finish((excerpt_appender *)local_2c8);
  cornelich::excerpt_appender::~excerpt_appender((excerpt_appender *)local_2c8);
  cornelich::vanilla_chronicle::~vanilla_chronicle((vanilla_chronicle *)&appender.m_buffer.m_data);
  cornelich::vanilla_chronicle_settings::~vanilla_chronicle_settings
            ((vanilla_chronicle_settings *)local_a0);
  return 0;
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto appender = chronicle.create_appender();
    appender.start_excerpt(1024);
    appender.write(42);
    appender.write("Some text", chr::writers::chars());
    appender.finish();
}